

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O3

void ff_acc_any(flexfloat_t *dest,flexfloat_t *a)

{
  dest->value = dest->value + a->value;
  flexfloat_sanitize(dest);
  return;
}

Assistant:

INLINE void ff_acc_any(flexfloat_t *dest, const flexfloat_t *a) {
    dest->value += a->value;
    #ifdef FLEXFLOAT_TRACKING
    dest->exact_value += a->exact_value;
    if(dest->tracking_fn) (dest->tracking_fn)(dest, dest->tracking_arg);
    #endif
    flexfloat_sanitize(dest);
    #ifdef FLEXFLOAT_STATS
    // TODO STATS
    // if(StatsEnabled) getOpStats(dest->desc)->minus += 1;
    #endif
}